

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

TagState * __thiscall
despot::BaseTag::MostLikelyState
          (BaseTag *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  double dVar1;
  value_type pSVar2;
  int iVar3;
  size_type sVar4;
  const_reference ppSVar5;
  reference pvVar6;
  const_reference ppTVar7;
  TagState *tagstate_1;
  int i_1;
  int id;
  TagState *tagstate;
  int i;
  int bestId;
  double maxWeight;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *local_18;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  BaseTag *this_local;
  
  local_18 = particles;
  particles_local = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)this;
  if (MostLikelyState(std::vector<despot::State*,std::allocator<despot::State*>>const&)::probs ==
      '\0') {
    iVar3 = __cxa_guard_acquire(&MostLikelyState(std::vector<despot::State*,std::allocator<despot::State*>>const&)
                                 ::probs);
    if (iVar3 != 0) {
      iVar3 = (**(code **)(*(long *)this + 0x10))();
      std::allocator<double>::allocator((allocator<double> *)((long)&maxWeight + 3));
      std::vector<double,_std::allocator<double>_>::vector
                (&MostLikelyState::probs,(long)iVar3,(allocator<double> *)((long)&maxWeight + 3));
      std::allocator<double>::~allocator((allocator<double> *)((long)&maxWeight + 3));
      __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,&MostLikelyState::probs,
                   &__dso_handle);
      __cxa_guard_release(&MostLikelyState(std::vector<despot::State*,std::allocator<despot::State*>>const&)
                           ::probs);
    }
  }
  _i = 0.0;
  tagstate._4_4_ = -1;
  tagstate._0_4_ = 0;
  while( true ) {
    sVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(local_18);
    if (sVar4 <= (ulong)(long)(int)tagstate) break;
    ppSVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (local_18,(long)(int)tagstate);
    pSVar2 = *ppSVar5;
    iVar3 = (**(code **)(*(long *)this + 0x58))(this,pSVar2);
    dVar1 = *(double *)(pSVar2 + 0x18);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&MostLikelyState::probs,(long)iVar3);
    *pvVar6 = dVar1 + *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&MostLikelyState::probs,(long)iVar3);
    if (_i < *pvVar6) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&MostLikelyState::probs,(long)iVar3);
      _i = *pvVar6;
      tagstate._4_4_ = iVar3;
    }
    tagstate._0_4_ = (int)tagstate + 1;
  }
  tagstate_1._0_4_ = 0;
  while( true ) {
    sVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(local_18);
    if (sVar4 <= (ulong)(long)(int)tagstate_1) break;
    ppSVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (local_18,(long)(int)tagstate_1);
    iVar3 = (**(code **)(*(long *)this + 0x58))(this,*ppSVar5);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&MostLikelyState::probs,(long)iVar3);
    *pvVar6 = 0.0;
    tagstate_1._0_4_ = (int)tagstate_1 + 1;
  }
  ppTVar7 = std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::operator[]
                      (&this->states_,(long)tagstate._4_4_);
  return *ppTVar7;
}

Assistant:

const TagState& BaseTag::MostLikelyState(
	const vector<State*>& particles) const {
	static vector<double> probs = vector<double>(NumStates());

	double maxWeight = 0;
	int bestId = -1;
	for (int i = 0; i < particles.size(); i++) {
		TagState* tagstate = static_cast<TagState*>(particles[i]);
		int id = GetIndex(tagstate);
		probs[id] += tagstate->weight;

		if (probs[id] > maxWeight) {
			maxWeight = probs[id];
			bestId = id;
		}
	}

	for (int i = 0; i < particles.size(); i++) {
		TagState* tagstate = static_cast<TagState*>(particles[i]);
		probs[GetIndex(tagstate)] = 0;
	}

	return *states_[bestId];
}